

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t *
containerptr_roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val,uint8_t *type,int *index)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  shared_container_t *sc;
  container_t *pcVar5;
  void *c;
  container_t *pcVar6;
  void **ppvVar7;
  ushort key;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint8_t new_type;
  uint8_t local_39;
  uint *local_38;
  
  iVar2 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  local_38 = (uint *)index;
  if (((long)iVar2 == 0) || (puVar3 = (r->high_low_container).keys, puVar3[(long)iVar2 + -1] == key)
     ) {
    uVar9 = iVar2 - 1;
  }
  else {
    if (iVar2 < 1) {
      uVar9 = 0xffffffff;
      goto LAB_00111803;
    }
    iVar8 = iVar2 + -1;
    uVar10 = 0;
    do {
      uVar9 = iVar8 + uVar10 >> 1;
      uVar1 = *(ushort *)((long)puVar3 + (ulong)(iVar8 + uVar10 & 0xfffffffe));
      if (uVar1 < key) {
        uVar10 = uVar9 + 1;
      }
      else {
        if (uVar1 <= key) goto LAB_00111717;
        iVar8 = uVar9 - 1;
      }
    } while ((int)uVar10 <= iVar8);
    uVar9 = ~uVar10;
  }
  if (-1 < (int)uVar9) {
LAB_00111717:
    uVar10 = uVar9 & 0xffff;
    if (iVar2 <= (int)uVar10) {
      __assert_fail("i < ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
    }
    ppvVar7 = (r->high_low_container).containers;
    puVar4 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)ppvVar7[uVar10];
    if (puVar4[uVar10] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar4 + uVar10);
      ppvVar7 = (r->high_low_container).containers;
    }
    *(shared_container_t **)((long)ppvVar7 + (ulong)(uVar10 * 8)) = sc;
    local_39 = (r->high_low_container).typecodes[uVar10];
    *type = local_39;
    pcVar6 = *(container_t **)((long)(r->high_low_container).containers + (ulong)(uVar10 * 8));
    pcVar5 = container_add(pcVar6,(uint16_t)val,local_39,&local_39);
    *local_38 = uVar9;
    if (pcVar5 == pcVar6) {
      return pcVar6;
    }
    container_free(pcVar6,*type);
    if ((int)uVar9 < (r->high_low_container).size) {
      (r->high_low_container).containers[uVar9] = pcVar5;
      (r->high_low_container).typecodes[uVar9] = local_39;
      *type = local_39;
      return pcVar5;
    }
    __assert_fail("i < ra->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1a3a,
                  "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                 );
  }
LAB_00111803:
  c = calloc(1,0x10);
  pcVar6 = container_add(c,(uint16_t)val,'\x02',type);
  ra_insert_new_key_value_at(&r->high_low_container,~uVar9,key,pcVar6,*type);
  *local_38 = ~uVar9;
  return pcVar6;
}

Assistant:

static inline container_t *containerptr_roaring_bitmap_add(
    roaring_bitmap_t *r, uint32_t val,
    uint8_t *type, int *index
){
    roaring_array_t *ra = &r->high_low_container;

    uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    if (i >= 0) {
        ra_unshare_container_at_index(ra, i);
        container_t *c = ra_get_container_at_index(ra, i, type);
        uint8_t new_type = *type;
        container_t *c2 = container_add(c, val & 0xFFFF, *type, &new_type);
        *index = i;
        if (c2 != c) {
            container_free(c, *type);
            ra_set_container_at_index(ra, i, c2, new_type);
            *type = new_type;
            return c2;
        } else {
            return c;
        }
    } else {
        array_container_t *new_ac = array_container_create();
        container_t *c = container_add(new_ac, val & 0xFFFF,
                                       ARRAY_CONTAINER_TYPE, type);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(ra, -i - 1, hb, c, *type);
        *index = -i - 1;
        return c;
    }
}